

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O3

AssertionResult
testing::internal::CmpHelperEQFailure<(anonymous_namespace)::Foo*,(anonymous_namespace)::Foo*>
          (char *lhs_expression,char *rhs_expression,Foo **lhs,Foo **rhs)

{
  Foo **value;
  AssertionResult AVar1;
  string local_58;
  string local_38;
  
  FormatForComparisonFailureMessage<(anonymous_namespace)::Foo*,(anonymous_namespace)::Foo*>
            (&local_58,(internal *)rhs_expression,lhs,rhs);
  FormatForComparisonFailureMessage<(anonymous_namespace)::Foo*,(anonymous_namespace)::Foo*>
            (&local_38,(internal *)lhs,value,rhs);
  EqFailure((internal *)lhs_expression,"p.get_ptr()","&foo",&local_58,&local_38,false);
  std::__cxx11::string::~string((string *)&local_38);
  AVar1 = (AssertionResult)std::__cxx11::string::~string((string *)&local_58);
  return AVar1;
}

Assistant:

AssertionResult CmpHelperEQFailure(const char* lhs_expression,
                                   const char* rhs_expression,
                                   const T1& lhs, const T2& rhs) {
  return EqFailure(lhs_expression,
                   rhs_expression,
                   FormatForComparisonFailureMessage(lhs, rhs),
                   FormatForComparisonFailureMessage(rhs, lhs),
                   false);
}